

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::uniformv
          (ReferenceContext *this,deInt32 location,DataType type,deInt32 count,void *v)

{
  ShaderProgram *pSVar1;
  pointer pUVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->m_currentProgram != (ShaderProgramObjectContainer *)0x0) {
    if (location == -1) {
      return;
    }
    if (-1 < location) {
      pSVar1 = this->m_currentProgram->m_program;
      uVar4 = (ulong)(uint)location;
      pUVar2 = (pSVar1->m_uniforms).
               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(pSVar1->m_uniforms).
                     super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 4) *
              0x6db6db6db6db6db7;
      if (((uVar4 <= uVar5 && uVar5 - uVar4 != 0) && (pUVar2[uVar4].type == type)) && (count == 1))
      {
        iVar3 = glu::getDataTypeScalarSize(type);
        memcpy(&(pSVar1->m_uniforms).
                super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4].value,v,(long)(iVar3 << 2));
        return;
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x502;
  }
  return;
}

Assistant:

void ReferenceContext::uniformv (deInt32 location, glu::DataType type, deInt32 count, const void* v)
{
	RC_IF_ERROR(m_currentProgram == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	std::vector<sglr::UniformSlot>& uniforms = m_currentProgram->m_program->m_uniforms;

	if (location == -1)
		return;

	RC_IF_ERROR(location < 0 || (size_t)location >= uniforms.size(), GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(uniforms[location].type != type, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(count != 1, GL_INVALID_OPERATION, RC_RET_VOID); // \todo [2013-12-13 pyry] Array uniforms.

	{
		const int scalarSize = glu::getDataTypeScalarSize(type);
		DE_ASSERT(scalarSize*sizeof(deUint32) <= sizeof(uniforms[location].value));
		deMemcpy(&uniforms[location].value, v, scalarSize*(int)sizeof(deUint32));
	}
}